

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool openjtalk_setVoiceNameU16(OpenJTalk *oj,char16_t *path)

{
  char16_t *pcVar1;
  _Bool _Var2;
  long lVar3;
  char *pcVar4;
  char temp [260];
  char acStack_118 [272];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if ((path != (char16_t *)0x0) && (*path != 0)) {
      lVar3 = 1;
      do {
        pcVar1 = path + lVar3;
        lVar3 = lVar3 + 1;
      } while (*pcVar1 != 0);
      if (lVar3 != 1) {
        pcVar4 = convert_charset_path((char *)path,CS_UTF_16LE,acStack_118,CS_UTF_8);
        if (pcVar4 == (char *)0x0) {
          return false;
        }
        _Var2 = set_voice_name(oj,acStack_118);
        return _Var2;
      }
    }
    oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setVoiceNameU16(OpenJTalk *oj, const char16_t *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}
	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlenU16(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = u16tou8_path(path, temp);
#else
	char *res = u16tou8_path(path, temp);
#endif
	if (!res)
	{
		return false;
	}
	return set_voice_name(oj, temp);
}